

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O1

plutovg_surface_t * plutovg_surface_load_from_image_data(void *data,int length)

{
  uchar *image;
  plutovg_surface_t *ppVar1;
  int in_R8D;
  int height;
  int width;
  int channels;
  int local_f4;
  int local_f0;
  int local_ec;
  stbi__context local_e8;
  
  local_e8.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  ppVar1 = (plutovg_surface_t *)0x0;
  local_e8.read_from_callbacks = 0;
  local_e8.callback_already_read = 0;
  local_e8.img_buffer_end = (stbi_uc *)((long)length + (long)data);
  local_e8.img_buffer = (stbi_uc *)data;
  local_e8.img_buffer_original = (stbi_uc *)data;
  local_e8.img_buffer_original_end = local_e8.img_buffer_end;
  image = stbi__load_and_postprocess_8bit(&local_e8,&local_f0,&local_f4,&local_ec,in_R8D);
  if (image != (uchar *)0x0) {
    ppVar1 = plutovg_surface_load_from_image(image,local_f0,local_f4);
  }
  return ppVar1;
}

Assistant:

plutovg_surface_t* plutovg_surface_load_from_image_data(const void* data, int length)
{
    int width, height, channels;
    stbi_uc* image = stbi_load_from_memory(data, length, &width, &height, &channels, STBI_rgb_alpha);
    if(image == NULL)
        return NULL;
    return plutovg_surface_load_from_image(image, width, height);
}